

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::EncryptAes256Cbc
          (ByteData *__return_storage_ptr__,ByteData *key,ByteData *iv,ByteData *data)

{
  allocator<unsigned_char> *this;
  pointer *this_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CfdException *pCVar4;
  pointer __n;
  uchar *key_00;
  size_type key_len;
  uchar *iv_00;
  size_type iv_len;
  uchar *bytes;
  uchar *bytes_out;
  size_type len;
  allocator local_179;
  string local_178;
  CfdSourceLocation local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  int local_124;
  size_type sStack_120;
  int ret;
  size_t written;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  size_t data_size;
  string local_b8;
  CfdSourceLocation local_98;
  undefined1 local_7d;
  allocator local_69;
  string local_68;
  CfdSourceLocation local_48;
  ByteData *local_30;
  ByteData *data_local;
  ByteData *iv_local;
  ByteData *key_local;
  
  local_30 = data;
  data_local = iv;
  iv_local = key;
  key_local = __return_storage_ptr__;
  sVar3 = ByteData::GetDataSize(key);
  if (sVar3 != 0x20) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x29e;
    local_48.funcname = "EncryptAes256Cbc";
    logger::warn<>(&local_48,"wally_aes key size NG.");
    local_7d = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_68,"EncryptAes256Cbc key size error.",&local_69)
    ;
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,&local_68);
    local_7d = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = ByteData::IsEmpty(local_30);
  if (!bVar1) {
    sVar3 = ByteData::GetDataSize(local_30);
    __n = (pointer)((sVar3 & 0xfffffffffffffff0) + 0x10);
    this = (allocator<unsigned_char> *)
           ((long)&key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __n;
    ::std::allocator<unsigned_char>::allocator(this);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,(size_type)__n,this
              );
    ::std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,iv_local);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written,data_local)
    ;
    sStack_120 = 0;
    this_00 = &iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    key_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    iv_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written);
    iv_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written);
    ByteData::GetBytes(&local_140,local_30);
    bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
    sVar3 = ByteData::GetDataSize(local_30);
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    iVar2 = wally_aes_cbc(key_00,key_len,iv_00,iv_len,bytes,sVar3,1,bytes_out,len,
                          &stack0xfffffffffffffee0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
    local_124 = iVar2;
    if (iVar2 != 0) {
      local_158.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                   ,0x2f);
      local_158.filename = local_158.filename + 1;
      local_158.line = 0x2b6;
      local_158.funcname = "EncryptAes256Cbc";
      logger::warn<int&>(&local_158,"wally_aes_cbc NG[{}].",&local_124);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_178,"EncryptAes256Cbc error.",&local_179);
      CfdException::CfdException(pCVar4,kCfdIllegalStateError,&local_178);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,sStack_120);
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    return __return_storage_ptr__;
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
               ,0x2f);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x2a4;
  local_98.funcname = "EncryptAes256Cbc";
  logger::warn<>(&local_98,"wally_aes data is Empty.");
  data_size._6_1_ = 1;
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_b8,"EncryptAes256Cbc data isEmpty.",
             (allocator *)((long)&data_size + 7));
  CfdException::CfdException(pCVar4,kCfdIllegalStateError,&local_b8);
  data_size._6_1_ = 0;
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::EncryptAes256Cbc(
    const ByteData &key, const ByteData &iv, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc key size error.");
  }

  if (data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "wally_aes data is Empty.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc data isEmpty.");
  }

  size_t data_size =
      (((data.GetDataSize() / kAesBlockLength) + 1) * kAesBlockLength);
  std::vector<uint8_t> output(data_size);
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> iv_data = iv.GetBytes();
  size_t written = 0;

  // Encrypt data using AES(CBC mode, PKCS#7 padding).
  int ret = wally_aes_cbc(
      key_data.data(), key_data.size(), iv_data.data(), iv_data.size(),
      data.GetBytes().data(), data.GetDataSize(), AES_FLAG_ENCRYPT,
      output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes_cbc NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "EncryptAes256Cbc error.");
  }

  output.resize(written);
  return ByteData(output);
}